

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::make_exception<const_char_*,_std::fpos<__mbstate_t>_>::operator()
          (make_exception<const_char_*,_std::fpos<__mbstate_t>_> *this,stringstream *msg,char *arg,
          fpos<__mbstate_t> args)

{
  std::operator<<((ostream *)(msg + 0x10),arg);
  std::ostream::_M_insert<long>((long)(msg + 0x10));
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }